

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS
ref_migrate_native_rcb_direction
          (REF_MPI ref_mpi,REF_INT n,REF_DBL *xyz,REF_DBL *transform,REF_INT npart,REF_INT offset,
          REF_INT *owners,REF_INT *locals,REF_MPI global_mpi,REF_INT *part,REF_INT seed,REF_INT dir,
          REF_BOOL twod)

{
  int first_rank;
  uint uVar1;
  uint uVar2;
  REF_DBL *pRVar3;
  ulong uVar4;
  void *pvVar5;
  undefined8 uVar6;
  long lVar7;
  int nitem;
  undefined4 in_register_00000034;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  REF_INT n_00;
  int nitem_00;
  int last_rank;
  REF_MPI ref_mpi_00;
  REF_INT bal_n1;
  REF_INT bal_n0;
  void *local_f0;
  void *local_e8;
  REF_DBL *bal_xyz1;
  undefined8 local_d8;
  REF_DBL *local_d0;
  REF_DBL *local_c8;
  REF_INT *bal_owners0;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  void *local_a0;
  REF_DBL *local_98;
  REF_MPI split_mpi;
  REF_LONG total;
  REF_INT *bal_locals1;
  REF_INT *bal_locals0;
  REF_INT *bal_owners1;
  REF_DBL *bal_xyz0;
  REF_DBL value1;
  REF_DBL value0;
  REF_DBL ratio;
  
  uVar1 = dir;
  if (npart == 0) {
    return 0;
  }
  uVar10 = (ulong)(uint)n;
  if (npart == 1) {
    if (-1 < n) {
      pRVar3 = (REF_DBL *)malloc(uVar10 * 4);
      if (pRVar3 == (REF_DBL *)0x0) {
        pcVar8 = "malloc my_id of REF_INT NULL";
        uVar6 = 0x19d;
        goto LAB_001f6569;
      }
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        *(REF_INT *)((long)pRVar3 + uVar4 * 4) = offset;
      }
      uVar1 = ref_mpi_blindsend(global_mpi,owners,pRVar3,1,n,&bal_xyz0,(REF_INT *)&bal_owners0,1);
      if (uVar1 == 0) {
        uVar1 = ref_mpi_blindsend(global_mpi,owners,locals,1,n,&bal_xyz1,(REF_INT *)&bal_owners0,1);
        if (uVar1 == 0) {
          uVar4 = 0;
          uVar10 = (ulong)(uint)bal_owners0;
          if ((int)(uint)bal_owners0 < 1) {
            uVar10 = uVar4;
          }
          for (; uVar10 != uVar4; uVar4 = uVar4 + 1) {
            part[*(int *)((long)bal_xyz1 + uVar4 * 4)] = *(REF_INT *)((long)bal_xyz0 + uVar4 * 4);
          }
          free(bal_xyz0);
          free(bal_xyz1);
LAB_001f66fc:
          free(pRVar3);
          return 0;
        }
        uVar10 = (ulong)uVar1;
        pcVar8 = "recv loc";
        uVar6 = 0x1a3;
      }
      else {
        uVar10 = (ulong)uVar1;
        pcVar8 = "recv part";
        uVar6 = 0x1a0;
      }
LAB_001f677f:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             uVar6,"ref_migrate_native_rcb_direction",uVar10,pcVar8);
      return (REF_STATUS)uVar10;
    }
    pcVar8 = "malloc my_id of REF_INT negative";
    uVar6 = 0x19d;
  }
  else {
    if (-1 < n) {
      local_d8 = CONCAT44(in_register_00000034,n);
      local_c8 = transform;
      pRVar3 = (REF_DBL *)malloc(uVar10 * 8);
      if (pRVar3 == (REF_DBL *)0x0) {
        pcVar8 = "malloc x of REF_DBL NULL";
        uVar6 = 0x1ab;
        goto LAB_001f6569;
      }
      if (2 < uVar1) {
        uVar1 = ref_migrate_split_dir(ref_mpi,(REF_INT)local_d8,xyz,local_c8,&dir);
        if (uVar1 != 0) {
          uVar10 = (ulong)uVar1;
          pcVar8 = "dir";
          uVar6 = 0x1ad;
          goto LAB_001f677f;
        }
        uVar1 = dir;
        if (2 < (uint)dir) {
          pcVar8 = "3D dir";
          uVar6 = 0x1ae;
          goto LAB_001f6515;
        }
      }
      uVar2 = ref_migrate_split_ratio(npart,&ratio);
      if (uVar2 != 0) {
        uVar10 = (ulong)uVar2;
        pcVar8 = "ratio";
        uVar6 = 0x1af;
        goto LAB_001f677f;
      }
      local_e8 = (void *)(((double)(seed % 3) / 3.0) * ratio);
      local_f0 = (void *)(((double)local_e8 - ratio) + 1.0);
      local_d0 = pRVar3;
      local_98 = xyz;
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        uVar2 = ref_matrix_ax(3,local_c8,xyz,(REF_DBL *)&bal_xyz0);
        if (uVar2 != 0) {
          uVar10 = (ulong)uVar2;
          pcVar8 = "ax";
          uVar6 = 0x1b6;
          goto LAB_001f677f;
        }
        local_d0[uVar4] = (REF_DBL)(&bal_xyz0)[uVar1];
        xyz = xyz + 3;
      }
      ref_mpi_00 = ref_mpi;
      total = uVar10;
      uVar1 = ref_mpi_allsum(ref_mpi,&total,1,2);
      pRVar3 = local_d0;
      if (uVar1 == 0) {
        uVar1 = ref_search_selection
                          (ref_mpi,(REF_INT)local_d8,local_d0,
                           (long)((double)local_e8 * (double)total),&value0);
        if (uVar1 == 0) {
          n_00 = (REF_INT)local_d8;
          uVar1 = ref_search_selection
                            (ref_mpi,n_00,pRVar3,(long)((double)local_f0 * (double)total),&value1);
          if (uVar1 == 0) {
            sVar9 = (ulong)(uint)(n_00 * 3) << 3;
            local_e8 = malloc(sVar9);
            if (local_e8 == (void *)0x0) {
              pcVar8 = "malloc xyz0 of REF_DBL NULL";
              uVar6 = 0x1c2;
            }
            else {
              pvVar5 = malloc(sVar9);
              if (pvVar5 == (void *)0x0) {
                pcVar8 = "malloc xyz1 of REF_DBL NULL";
                uVar6 = 0x1c3;
              }
              else {
                sVar9 = uVar10 * 4;
                local_f0 = malloc(sVar9);
                if (local_f0 == (void *)0x0) {
                  pcVar8 = "malloc owners0 of REF_INT NULL";
                  uVar6 = 0x1c4;
                }
                else {
                  local_a0 = malloc(sVar9);
                  if (local_a0 == (void *)0x0) {
                    pcVar8 = "malloc owners1 of REF_INT NULL";
                    uVar6 = 0x1c5;
                  }
                  else {
                    local_a8 = pvVar5;
                    local_b0 = malloc(sVar9);
                    if (local_b0 == (void *)0x0) {
                      pcVar8 = "malloc locals0 of REF_INT NULL";
                      uVar6 = 0x1c6;
                    }
                    else {
                      local_b8 = malloc(sVar9);
                      if (local_b8 != (void *)0x0) {
                        nitem_00 = 0;
                        nitem = 0;
                        for (uVar4 = 0; uVar4 != uVar10; uVar4 = uVar4 + 1) {
                          if ((local_d0[uVar4] < value0) || (value1 < local_d0[uVar4])) {
                            for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
                              *(REF_DBL *)((long)local_e8 + lVar7 * 8 + (long)(nitem * 3) * 8) =
                                   local_98[lVar7];
                            }
                            *(REF_INT *)((long)local_f0 + (long)nitem * 4) = owners[uVar4];
                            *(REF_INT *)((long)local_b0 + (long)nitem * 4) = locals[uVar4];
                            nitem = nitem + 1;
                          }
                          else {
                            for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
                              *(REF_DBL *)((long)local_a8 + lVar7 * 8 + (long)(nitem_00 * 3) * 8) =
                                   local_98[lVar7];
                            }
                            *(REF_INT *)((long)local_a0 + (long)nitem_00 * 4) = owners[uVar4];
                            *(REF_INT *)((long)local_b8 + (long)nitem_00 * 4) = locals[uVar4];
                            nitem_00 = nitem_00 + 1;
                          }
                          local_98 = local_98 + 3;
                        }
                        if (nitem + nitem_00 != (int)local_d8) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,0x1d8,"ref_migrate_native_rcb_direction","conservation",uVar10,
                                 (long)(nitem + nitem_00));
                          return 1;
                        }
                        first_rank = npart / 2;
                        last_rank = first_rank + -1;
                        uVar1 = ref_mpi_balance(ref_mpi_00,3,nitem,local_e8,0,last_rank,&bal_n0,
                                                &bal_xyz0,3);
                        if (uVar1 == 0) {
                          uVar1 = ref_mpi_balance(ref_mpi_00,3,nitem_00,local_a8,first_rank,
                                                  ref_mpi_00->n + -1,&bal_n1,&bal_xyz1,3);
                          if (uVar1 == 0) {
                            uVar1 = ref_mpi_balance(ref_mpi_00,1,nitem,local_f0,0,last_rank,&bal_n0,
                                                    &bal_owners0,1);
                            if (uVar1 == 0) {
                              uVar1 = ref_mpi_balance(ref_mpi_00,1,nitem_00,local_a0,first_rank,
                                                      ref_mpi_00->n + -1,&bal_n1,&bal_owners1,1);
                              if (uVar1 == 0) {
                                uVar1 = ref_mpi_balance(ref_mpi_00,1,nitem,local_b0,0,last_rank,
                                                        &bal_n0,&bal_locals0,1);
                                if (uVar1 == 0) {
                                  uVar1 = ref_mpi_balance(ref_mpi_00,1,nitem_00,local_b8,first_rank,
                                                          ref_mpi_00->n + -1,&bal_n1,&bal_locals1,1)
                                  ;
                                  if (uVar1 == 0) {
                                    uVar1 = ref_mpi_front_comm(ref_mpi_00,&split_mpi,first_rank);
                                    if (uVar1 == 0) {
                                      if (ref_mpi_00->id < first_rank) {
                                        uVar1 = ref_migrate_native_rcb_direction
                                                          (split_mpi,bal_n0,bal_xyz0,local_c8,
                                                           first_rank,offset,
                                                           (REF_INT *)
                                                           CONCAT44(bal_owners0._4_4_,
                                                                    (uint)bal_owners0),bal_locals0,
                                                           global_mpi,part,seed,-1,
                                                           (REF_BOOL)ref_mpi_00);
                                        if (uVar1 != 0) {
                                          uVar10 = (ulong)uVar1;
                                          pcVar8 = "recurse 0";
                                          uVar6 = 0x203;
                                          goto LAB_001f677f;
                                        }
                                      }
                                      else {
                                        uVar1 = ref_migrate_native_rcb_direction
                                                          (split_mpi,bal_n1,bal_xyz1,local_c8,
                                                           npart - first_rank,offset + first_rank,
                                                           bal_owners1,bal_locals1,global_mpi,part,
                                                           seed,-1,(REF_BOOL)ref_mpi_00);
                                        if (uVar1 != 0) {
                                          uVar10 = (ulong)uVar1;
                                          pcVar8 = "recurse 1";
                                          uVar6 = 0x208;
                                          goto LAB_001f677f;
                                        }
                                      }
                                      uVar1 = ref_mpi_join_comm(split_mpi);
                                      if (uVar1 == 0) {
                                        uVar1 = ref_mpi_free(split_mpi);
                                        if (uVar1 == 0) {
                                          free(bal_locals1);
                                          free(bal_locals0);
                                          free(bal_owners1);
                                          free((void *)CONCAT44(bal_owners0._4_4_,(uint)bal_owners0)
                                              );
                                          free(bal_xyz1);
                                          free(bal_xyz0);
                                          free(local_b8);
                                          free(local_b0);
                                          free(local_a0);
                                          free(local_f0);
                                          free(local_a8);
                                          free(local_e8);
                                          pRVar3 = local_d0;
                                          goto LAB_001f66fc;
                                        }
                                        uVar10 = (ulong)uVar1;
                                        pcVar8 = "new free";
                                        uVar6 = 0x20c;
                                      }
                                      else {
                                        uVar10 = (ulong)uVar1;
                                        pcVar8 = "join";
                                        uVar6 = 0x20b;
                                      }
                                    }
                                    else {
                                      uVar10 = (ulong)uVar1;
                                      pcVar8 = "split";
                                      uVar6 = 0x1f6;
                                    }
                                  }
                                  else {
                                    uVar10 = (ulong)uVar1;
                                    pcVar8 = "split local 1";
                                    uVar6 = 500;
                                  }
                                }
                                else {
                                  uVar10 = (ulong)uVar1;
                                  pcVar8 = "split local 0";
                                  uVar6 = 0x1f0;
                                }
                              }
                              else {
                                uVar10 = (ulong)uVar1;
                                pcVar8 = "split owner 1";
                                uVar6 = 0x1ec;
                              }
                            }
                            else {
                              uVar10 = (ulong)uVar1;
                              pcVar8 = "split owner 0";
                              uVar6 = 0x1e8;
                            }
                          }
                          else {
                            uVar10 = (ulong)uVar1;
                            pcVar8 = "split 1";
                            uVar6 = 0x1e4;
                          }
                        }
                        else {
                          uVar10 = (ulong)uVar1;
                          pcVar8 = "split 0";
                          uVar6 = 0x1e0;
                        }
                        goto LAB_001f677f;
                      }
                      pcVar8 = "malloc locals1 of REF_INT NULL";
                      uVar6 = 0x1c7;
                      local_b8 = (void *)0x0;
                    }
                  }
                }
              }
            }
LAB_001f6569:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,uVar6,"ref_migrate_native_rcb_direction",pcVar8);
            return 2;
          }
          pcVar8 = "target";
          uVar6 = 0x1c0;
        }
        else {
          pcVar8 = "target";
          uVar6 = 0x1be;
        }
      }
      else {
        pcVar8 = "high_pos";
        uVar6 = 0x1bb;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             uVar6,"ref_migrate_native_rcb_direction",(ulong)uVar1,pcVar8);
      return uVar1;
    }
    pcVar8 = "malloc x of REF_DBL negative";
    uVar6 = 0x1ab;
  }
LAB_001f6515:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar6,
         "ref_migrate_native_rcb_direction",pcVar8);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_native_rcb_direction(
    REF_MPI ref_mpi, REF_INT n, REF_DBL *xyz, REF_DBL *transform, REF_INT npart,
    REF_INT offset, REF_INT *owners, REF_INT *locals, REF_MPI global_mpi,
    REF_INT *part, REF_INT seed, REF_INT dir, REF_BOOL twod) {
  REF_INT i, j, n0, n1, npart0, npart1, offset0, offset1;
  REF_INT bal_n0, bal_n1;
  REF_DBL *xyz0, *xyz1, *x;
  REF_DBL *bal_xyz0, *bal_xyz1;
  REF_INT *owners0, *owners1;
  REF_INT *bal_owners0, *bal_owners1;
  REF_INT *locals0, *locals1;
  REF_INT *bal_locals0, *bal_locals1;
  REF_DBL ratio, value0, value1;
  REF_LONG position, total;
  REF_MPI split_mpi;
  REF_INT seed_base = 3;
  REF_DBL ratio_shift, ratio0, ratio1;
  REF_BOOL cycle_dir = REF_FALSE;

  if (0 == npart) return REF_SUCCESS;

  if (1 == npart) {
    REF_INT *my_id, *recv_part, *recv_locals, nrecv;
    ref_malloc_init(my_id, n, REF_INT, offset);
    RSS(ref_mpi_blindsend(global_mpi, owners, my_id, 1, n, (void **)&recv_part,
                          &nrecv, REF_INT_TYPE),
        "recv part");
    RSS(ref_mpi_blindsend(global_mpi, owners, locals, 1, n,
                          (void **)&recv_locals, &nrecv, REF_INT_TYPE),
        "recv loc");
    for (i = 0; i < nrecv; i++) part[recv_locals[i]] = recv_part[i];
    ref_free(recv_part);
    ref_free(recv_locals);
    ref_free(my_id);
    return REF_SUCCESS;
  }

  ref_malloc(x, n, REF_DBL);
  if (dir < 0 || 2 < dir)
    RSS(ref_migrate_split_dir(ref_mpi, n, xyz, transform, &dir), "dir");
  RAS(-1 < dir && dir < 3, "3D dir");
  RSS(ref_migrate_split_ratio(npart, &ratio), "ratio");
  ratio_shift = (REF_DBL)(seed % seed_base) / (REF_DBL)seed_base;
  ratio0 = ratio * ratio_shift;
  ratio1 = 1.0 - (ratio - ratio0);

  for (i = 0; i < n; i++) {
    REF_DBL transformed[3];
    RSS(ref_matrix_ax(3, transform, &(xyz[3 * i]), transformed), "ax");
    x[i] = transformed[dir];
  }

  total = (REF_LONG)n;
  RSS(ref_mpi_allsum(ref_mpi, &total, 1, REF_LONG_TYPE), "high_pos");

  position = (REF_LONG)((REF_DBL)total * ratio0);
  RSS(ref_search_selection(ref_mpi, n, x, position, &value0), "target");
  position = (REF_LONG)((REF_DBL)total * ratio1);
  RSS(ref_search_selection(ref_mpi, n, x, position, &value1), "target");

  ref_malloc(xyz0, 3 * n, REF_DBL);
  ref_malloc(xyz1, 3 * n, REF_DBL);
  ref_malloc(owners0, n, REF_INT);
  ref_malloc(owners1, n, REF_INT);
  ref_malloc(locals0, n, REF_INT);
  ref_malloc(locals1, n, REF_INT);

  n0 = 0;
  n1 = 0;
  for (i = 0; i < n; i++) {
    if (x[i] < value0 || value1 < x[i]) {
      for (j = 0; j < 3; j++) xyz0[j + 3 * n0] = xyz[j + 3 * i];
      owners0[n0] = owners[i];
      locals0[n0] = locals[i];
      n0++;
    } else {
      for (j = 0; j < 3; j++) xyz1[j + 3 * n1] = xyz[j + 3 * i];
      owners1[n1] = owners[i];
      locals1[n1] = locals[i];
      n1++;
    }
  }
  REIS(n, n0 + n1, "conservation");
  npart0 = npart / 2;
  npart1 = npart - npart0;
  offset0 = offset;
  offset1 = offset + npart0;

  RSS(ref_mpi_balance(ref_mpi, 3, n0, (void *)xyz0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_xyz0), REF_DBL_TYPE),
      "split 0");
  RSS(ref_mpi_balance(ref_mpi, 3, n1, (void *)xyz1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_xyz1),
                      REF_DBL_TYPE),
      "split 1");

  RSS(ref_mpi_balance(ref_mpi, 1, n0, (void *)owners0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_owners0), REF_INT_TYPE),
      "split owner 0");
  RSS(ref_mpi_balance(ref_mpi, 1, n1, (void *)owners1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_owners1),
                      REF_INT_TYPE),
      "split owner 1");

  RSS(ref_mpi_balance(ref_mpi, 1, n0, (void *)locals0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_locals0), REF_INT_TYPE),
      "split local 0");
  RSS(ref_mpi_balance(ref_mpi, 1, n1, (void *)locals1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_locals1),
                      REF_INT_TYPE),
      "split local 1");

  RSS(ref_mpi_front_comm(ref_mpi, &split_mpi, npart0), "split");

  if (cycle_dir) {
    dir += 1;
    if (dir > 2) dir -= 3;
    if (twod && dir > 1) dir -= 2; /* twod skips Z */
  } else {
    dir = -1; /* direction computed in next recursion */
  }
  if (ref_mpi_rank(ref_mpi) < npart0) {
    RSS(ref_migrate_native_rcb_direction(
            split_mpi, bal_n0, bal_xyz0, transform, npart0, offset0,
            bal_owners0, bal_locals0, global_mpi, part, seed, dir, twod),
        "recurse 0");
  } else {
    RSS(ref_migrate_native_rcb_direction(
            split_mpi, bal_n1, bal_xyz1, transform, npart1, offset1,
            bal_owners1, bal_locals1, global_mpi, part, seed, dir, twod),
        "recurse 1");
  }

  RSS(ref_mpi_join_comm(split_mpi), "join");
  RSS(ref_mpi_free(split_mpi), "new free");

  ref_free(bal_locals1);
  ref_free(bal_locals0);

  ref_free(bal_owners1);
  ref_free(bal_owners0);

  ref_free(bal_xyz1);
  ref_free(bal_xyz0);

  ref_free(locals1);
  ref_free(locals0);

  ref_free(owners1);
  ref_free(owners0);

  ref_free(xyz1);
  ref_free(xyz0);

  ref_free(x);
  return REF_SUCCESS;
}